

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

void arena_reset_prepare_background_thread(tsd_t *tsd,uint arena_ind)

{
  background_thread_info_t *pbVar1;
  ulong uVar2;
  
  malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_lock);
  pbVar1 = duckdb_je_background_thread_info;
  if ((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) {
    uVar2 = (ulong)arena_ind % duckdb_je_max_background_threads;
    malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_info[uVar2].mtx);
    pbVar1[uVar2].state = background_thread_paused;
    pbVar1[uVar2].mtx.field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&pbVar1[uVar2].mtx.field_0 + 0x48));
    return;
  }
  return;
}

Assistant:

static void
arena_reset_prepare_background_thread(tsd_t *tsd, unsigned arena_ind) {
	/* Temporarily disable the background thread during arena reset. */
	if (have_background_thread) {
		malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
		if (background_thread_enabled()) {
			background_thread_info_t *info =
			    background_thread_info_get(arena_ind);
			assert(info->state == background_thread_started);
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			info->state = background_thread_paused;
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
	}
}